

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ancientzip.cpp
# Opt level: O3

int __thiscall
FZipExploder::BuildDecoder
          (FZipExploder *this,TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode> *decoder,
          TableBuilder *values,int numvals)

{
  uchar uVar1;
  ulong uVar2;
  uint uVar3;
  uint uVar4;
  FZipExploder *this_00;
  uchar uVar5;
  
  qsort(values,(long)numvals,4,buildercmp);
  if (numvals < 1) {
    uVar3 = decoder->Count;
    TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::Grow(decoder,0x100);
    decoder->Count = decoder->Count + 0x100;
    memset(decoder->Array + uVar3,0,0x400);
  }
  else {
    uVar2 = (ulong)(uint)numvals + 1;
    uVar3 = 0;
    uVar4 = 0;
    uVar5 = '\0';
    do {
      uVar4 = uVar4 + (uVar3 & 0xffff);
      uVar1 = values[uVar2 - 2].Length;
      uVar3 = uVar3 & 0xffff;
      if (uVar5 != uVar1) {
        uVar3 = 1 << (0x10 - uVar1 & 0x1f);
      }
      values[uVar2 - 2].Code =
           (ushort)""[uVar4 & 0xf] << 0xc | (ushort)""[uVar4 >> 4 & 0xf] << 8 |
           (ushort)""[uVar4 >> 8 & 0xf] << 4 | (ushort)""[uVar4 >> 0xc & 0xf];
      uVar2 = uVar2 - 1;
      uVar5 = uVar1;
    } while (1 < uVar2);
    uVar3 = decoder->Count;
    TArray<FZipExploder::HuffNode,_FZipExploder::HuffNode>::Grow(decoder,0x100);
    decoder->Count = decoder->Count + 0x100;
    this_00 = (FZipExploder *)(decoder->Array + uVar3);
    memset(this_00,0,0x400);
    if (0 < numvals) {
      uVar2 = 0;
      do {
        InsertCode(this_00,decoder,0,8,values[uVar2].Code,(uint)values[uVar2].Length,
                   values[uVar2].Value);
        uVar2 = uVar2 + 1;
      } while ((uint)numvals != uVar2);
    }
  }
  return 0;
}

Assistant:

int FZipExploder::BuildDecoder(TArray<HuffNode> &decoder, TableBuilder *values, int numvals)
{
	int i;

	qsort(values, numvals, sizeof(*values), buildercmp);

	// Generate the Shannon-Fano tree:
	unsigned short code = 0;
	unsigned short code_increment = 0;
	unsigned short last_bit_length = 0;
	for (i = numvals - 1; i >= 0; --i)
	{
		code += code_increment;
		if (values[i].Length != last_bit_length)
		{
			last_bit_length = values[i].Length;
			code_increment = 1 << (16 - last_bit_length);
		}
		// Reverse the order of the bits in the code before storing it.
		values[i].Code = BitReverse4[code >> 12] |
						(BitReverse4[(code >> 8) & 0xf] << 4) |
						(BitReverse4[(code >> 4) & 0xf] << 8) |
						(BitReverse4[code & 0xf] << 12);
	}

	// Insert each code into the hierarchical table. The top level is FIRST_BIT_LEN bits,
	// and the other levels are REST_BIT_LEN bits. If a code does not completely fill
	// a level, every permutation for the remaining bits is filled in to
	// match this one.
	InitTable(decoder, 1 << FIRST_BIT_LEN);		// Set up the top level.
	for (i = 0; i < numvals; ++i)
	{
		InsertCode(decoder, 0, FIRST_BIT_LEN, values[i].Code, values[i].Length, values[i].Value);
	}
	return 0;
}